

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidyCleanAndRepair(TidyDoc tdoc)

{
  TidyTagId *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  TidyTagId TVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  Node *node;
  Dict *pDVar15;
  Bool BVar16;
  Bool BVar17;
  int iVar18;
  Node *pNVar19;
  AttVal *pAVar20;
  tmbstr ptVar21;
  Stack *pSVar22;
  Node *pNVar23;
  uint code;
  char *property;
  TidyDocImpl *impl;
  long lVar24;
  AttVal *attval;
  bool bVar25;
  
  if (tdoc == (TidyDoc)0x0) {
    return -0x16;
  }
  iVar18 = tdoc[0xd0]._opaque;
  iVar2 = tdoc[0x78]._opaque;
  iVar3 = tdoc[0x7e]._opaque;
  BVar17 = tdoc[0x24]._opaque;
  iVar4 = tdoc[0x5c]._opaque;
  iVar5 = tdoc[0x60]._opaque;
  iVar6 = tdoc[0xe6]._opaque;
  iVar7 = tdoc[0xe2]._opaque;
  iVar8 = tdoc[0xe4]._opaque;
  iVar9 = tdoc[0x80]._opaque;
  iVar10 = tdoc[0x84]._opaque;
  uVar14 = *(undefined8 *)(tdoc + 0xd08);
  *(undefined8 *)(tdoc + 0xd08) = 0;
  if (tdoc[0xec]._opaque != 0) goto LAB_001503cc;
  prvTidyCleanStyle((TidyDocImpl *)tdoc,(Node *)tdoc);
  if (iVar10 != 0) {
    prvTidyNestedEmphasis((TidyDocImpl *)tdoc,(Node *)tdoc);
  }
  prvTidyList2BQ((TidyDocImpl *)tdoc,(Node *)tdoc);
  prvTidyBQ2Div((TidyDocImpl *)tdoc,(Node *)tdoc);
  if (iVar2 != 0) {
    prvTidyEmFromI((TidyDocImpl *)tdoc,(Node *)tdoc);
  }
  if ((iVar18 != 0) && (BVar16 = prvTidyIsWord2000((TidyDocImpl *)tdoc), BVar16 != no)) {
    prvTidyDropSections((TidyDocImpl *)tdoc,(Node *)tdoc);
    prvTidyCleanWord2000((TidyDocImpl *)tdoc,(Node *)tdoc);
    prvTidyDropEmptyElements((TidyDocImpl *)tdoc,(Node *)tdoc);
  }
  if (iVar3 != 0) {
    prvTidyCleanDocument((TidyDocImpl *)tdoc);
  }
  if (iVar4 != 0) {
    prvTidyCleanGoogleDocument((TidyDocImpl *)tdoc);
  }
  prvTidyTidyMetaCharset((TidyDocImpl *)tdoc);
  BVar16 = prvTidyCheckNodeIntegrity((Node *)tdoc);
  if (BVar16 == no) {
    (**(code **)(**(long **)(tdoc + 0xd20) + 0x18))
              (*(long **)(tdoc + 0xd20),"\nPanic - tree has lost its integrity\n");
  }
  pNVar19 = prvTidyFindDocType((TidyDocImpl *)tdoc);
  if (((pNVar19 != (Node *)0x0) &&
      (pAVar20 = prvTidyGetAttrByName(pNVar19,"PUBLIC"), pAVar20 != (AttVal *)0x0)) &&
     (ptVar21 = pAVar20->value, ptVar21 != (tmbstr)0x0)) {
    if (*(long *)(tdoc + 0xd2a) != 0) {
      (**(code **)(**(long **)(tdoc + 0xd20) + 0x10))
                (*(long **)(tdoc + 0xd20),*(long *)(tdoc + 0xd2a));
      ptVar21 = pAVar20->value;
    }
    ptVar21 = prvTidytmbstrdup(*(TidyAllocator **)(tdoc + 0xd20),ptVar21);
    *(tmbstr *)(tdoc + 0xd2a) = ptVar21;
  }
  if (*(long *)(tdoc + 6) != 0) {
    if (iVar5 == 0) {
      if (iVar7 == 0) goto LAB_0014fe2c;
      BVar16 = yes;
      prvTidySetXHTMLDocType((TidyDocImpl *)tdoc);
    }
    else {
      if ((*(int *)(*(long *)(tdoc + 0x1c) + 0x1c) != 0) &&
         (pNVar19 = prvTidyFindDocType((TidyDocImpl *)tdoc), pNVar19 != (Node *)0x0)) {
        prvTidyRemoveNode(pNVar19);
      }
LAB_0014fe2c:
      prvTidyFixDocType((TidyDocImpl *)tdoc);
      BVar16 = no;
    }
    prvTidyFixAnchors((TidyDocImpl *)tdoc,(Node *)tdoc,BVar17,yes);
    prvTidyFixXhtmlNamespace((TidyDocImpl *)tdoc,BVar16);
    prvTidyFixLanguageInformation((TidyDocImpl *)tdoc,(Node *)tdoc,BVar16,yes);
    if (iVar9 != 0) {
      prvTidyAddGenerator((TidyDocImpl *)tdoc);
    }
  }
  if ((iVar6 != 0) && (iVar8 != 0)) {
    prvTidyFixXmlDecl((TidyDocImpl *)tdoc);
  }
  if (*(long *)(tdoc + 0x1c) != 0) {
    if ((*(byte *)(*(long *)(tdoc + 0x1c) + 0x2a) & 6) != 0) {
      pSVar22 = prvTidynewStack((TidyDocImpl *)tdoc,0x10);
      iVar18 = tdoc[0x7e]._opaque;
      iVar2 = tdoc[0xc0]._opaque;
      pNVar23 = prvTidyFindBody((TidyDocImpl *)tdoc);
      pNVar19 = (Node *)tdoc;
      while (pNVar19 != (Node *)0x0) {
        node = pNVar19->next;
        pAVar20 = (AttVal *)&pNVar19->attributes;
        do {
          pAVar20 = pAVar20->next;
          if (pAVar20 == (AttVal *)0x0) {
            if (pNVar19 != pNVar23) goto LAB_0014ff29;
            if (iVar2 == 0) goto LAB_0015003a;
            goto LAB_001500fe;
          }
        } while ((pAVar20->dict == (Attribute *)0x0) || (pAVar20->dict->id != TidyAttr_ALIGN));
        if (iVar2 == 0) {
          pAVar20 = prvTidyAttrGetById(pNVar19,TidyAttr_ALIGN);
          prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar19,pAVar20,0x255);
          if (pNVar19 != pNVar23) goto LAB_0014ff29;
LAB_0015003a:
          for (lVar24 = 0; lVar24 != 0x18; lVar24 = lVar24 + 4) {
            pAVar20 = prvTidyAttrGetById(pNVar19,*(TidyAttrId *)((long)BadBody5Attribs + lVar24));
            if (pAVar20 != (AttVal *)0x0) {
              prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar19,pAVar20,0x255);
            }
          }
        }
        else if (pNVar19 != pNVar23) {
LAB_0014ff29:
          if (pNVar19->tag == (Dict *)0x0) {
LAB_0014ffaf:
            BVar17 = prvTidynodeIsElement(pNVar19);
            if ((BVar17 == no) || (pDVar15 = pNVar19->tag, pDVar15 == (Dict *)0x0))
            goto LAB_001500fe;
            if ((pDVar15->versions & 0x6e000) != 0) {
              lVar24 = 8;
              do {
                if (lVar24 + 0x10 == 0xd8) goto LAB_001500fe;
                pTVar1 = (TidyTagId *)((long)&html5Info[0].tag + lVar24);
                lVar24 = lVar24 + 0x10;
              } while (*pTVar1 != pDVar15->id);
            }
          }
          else {
            TVar11 = pNVar19->tag->id;
            if (1 < TVar11 - TidyTag_FRAME) {
              if (TVar11 == TidyTag_TT) {
                if (iVar18 != 0) {
                  property = "font-family: monospace";
                  goto LAB_001500c6;
                }
              }
              else if (TVar11 == TidyTag_APPLET) {
                if (iVar18 != 0) {
                  TVar11 = TidyTag_OBJECT;
LAB_001500d3:
                  prvTidyCoerceNode((TidyDocImpl *)tdoc,pNVar19,TVar11,yes,no);
                  goto LAB_001500fe;
                }
              }
              else if (TVar11 != TidyTag_BASEFONT) {
                if (TVar11 == TidyTag_BIG) {
                  if (iVar18 != 0) {
                    property = "font-size: larger";
LAB_001500c6:
                    prvTidyAddStyleProperty((TidyDocImpl *)tdoc,pNVar19,property);
                    TVar11 = TidyTag_SPAN;
                    goto LAB_001500d3;
                  }
                }
                else if ((((TVar11 != TidyTag_CENTER) && (TVar11 != TidyTag_DIR)) &&
                         (TVar11 != TidyTag_FONT)) && (TVar11 != TidyTag_NOFRAMES)) {
                  if (TVar11 == TidyTag_STRIKE) {
                    if (iVar18 != 0) {
                      property = "text-decoration: line-through";
                      goto LAB_001500c6;
                    }
                  }
                  else {
                    if (TVar11 != TidyTag_ACRONYM) goto LAB_0014ffaf;
                    if (iVar18 != 0) {
                      TVar11 = TidyTag_ABBR;
                      goto LAB_001500d3;
                    }
                  }
                }
              }
            }
          }
          if (iVar2 == 0) {
            prvTidyReport((TidyDocImpl *)tdoc,pNVar19,pNVar19,0x271);
          }
        }
LAB_001500fe:
        if (pNVar19->content == (Node *)0x0) {
          pNVar19 = node;
          if (node == (Node *)0x0) {
            pNVar19 = prvTidypop(pSVar22);
          }
        }
        else {
          prvTidypush(pSVar22,node);
          pNVar19 = pNVar19->content;
        }
      }
      prvTidyfreeStack(pSVar22);
    }
    pSVar22 = prvTidynewStack((TidyDocImpl *)tdoc,0x10);
    uVar12 = *(uint *)(*(long *)(tdoc + 0x1c) + 0x24);
    uVar13 = *(uint *)(*(long *)(tdoc + 0x1c) + 0x28);
    if (uVar13 == 0) {
      uVar13 = uVar12;
    }
    bVar25 = (uVar13 & 0x60124) == 0;
    iVar18 = tdoc[0xc0]._opaque;
    pNVar19 = (Node *)tdoc;
    while (pNVar19 != (Node *)0x0) {
      pNVar23 = pNVar19->next;
      BVar17 = prvTidynodeIsElement(pNVar19);
      if (((BVar17 != no) && (pDVar15 = pNVar19->tag, pDVar15 != (Dict *)0x0)) &&
         (tdoc[0xec]._opaque == 0)) {
        if ((iVar18 == 0) || ((pDVar15->versions & uVar13) != 0)) {
          if (((pDVar15->versions & 0xe000) != 0) &&
             ((tdoc[0x7e]._opaque == 0 ||
              ((pDVar15->id != TidyTag_NOBR && (pDVar15->id != TidyTag_WBR)))))) {
            BVar17 = prvTidynodeIsAutonomousCustomFormat(pNVar19);
            if (((uVar12 & 0x60000) == 0) || (BVar17 == no)) {
              prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar19,0x270);
            }
            if (pNVar19->tag != (Dict *)0x0) {
              TVar11 = pNVar19->tag->id;
              if (TVar11 == TidyTag_SPACER) {
                *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 1;
              }
              else if (TVar11 == TidyTag_NOBR) {
                *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 4;
              }
              else if (TVar11 == TidyTag_LAYER) {
                *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 2;
              }
            }
          }
        }
        else {
          prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar19,bVar25 + 0x239);
        }
      }
      BVar17 = prvTidynodeIsElement(pNVar19);
      if (BVar17 != no) {
        pAVar20 = pNVar19->attributes;
LAB_001502a5:
        while (attval = pAVar20, attval != (AttVal *)0x0) {
          pAVar20 = attval->next;
          BVar17 = prvTidyAttributeIsProprietary(pNVar19,attval);
          if ((uVar12 & 0x60000) == 0 && iVar18 == 0) goto LAB_001502f7;
          BVar16 = prvTidyAttributeIsMismatched(pNVar19,attval,(TidyDocImpl *)tdoc);
          if (BVar17 != no) goto LAB_001502fc;
          if (BVar16 != no) {
            code = bVar25 | 0x254;
            if ((uVar12 & 0x60000) != 0) {
              code = (iVar18 == 0) + 0x254;
            }
            goto LAB_00150313;
          }
        }
      }
      if (pNVar19->content == (Node *)0x0) {
        pNVar19 = pNVar23;
        if (pNVar23 == (Node *)0x0) {
          pNVar19 = prvTidypop(pSVar22);
        }
      }
      else {
        prvTidypush(pSVar22,pNVar23);
        pNVar19 = pNVar19->content;
      }
    }
    prvTidyfreeStack(pSVar22);
    if ((*(int *)(*(long *)(tdoc + 0x1c) + 0x1c) == 0) && (tdoc[0xd1d]._opaque != 0)) {
      pNVar19 = prvTidyFindXmlDecl((TidyDocImpl *)tdoc);
      prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar19,0x291);
    }
  }
  prvTidyCleanHead((TidyDocImpl *)tdoc);
LAB_001503cc:
  *(undefined8 *)(tdoc + 0xd08) = uVar14;
  iVar18 = tidyDocStatus((TidyDocImpl *)tdoc);
  return iVar18;
LAB_001502f7:
  if (BVar17 != no) {
LAB_001502fc:
    if (tdoc[0xce]._opaque != 0) {
      code = 0x26f;
LAB_00150313:
      prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar19,attval,code);
    }
    if (tdoc[0x40]._opaque != 0) {
      prvTidyRemoveAttribute((TidyDocImpl *)tdoc,pNVar19,attval);
    }
  }
  goto LAB_001502a5;
}

Assistant:

int TIDY_CALL        tidyCleanAndRepair( TidyDoc tdoc )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
      return tidyDocCleanAndRepair( impl );
    return -EINVAL;
}